

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clmul_4bytes.cpp
# Opt level: O0

Sketch * ConstructClMul4Bytes(int bits,int implementation)

{
  long lVar1;
  int in_ESI;
  int in_EDI;
  long in_FS_OFFSET;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDI == 0x20) {
    local_10 = (SketchImpl<(anonymous_namespace)::GenField<unsigned_int,_32,_141U,_&(anonymous_namespace)::MulWithClMulReduce,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::SQR2_TABLE_32,_&(anonymous_namespace)::SQR4_TABLE_32,_&(anonymous_namespace)::SQR8_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32,_IdTrans,_&ID_TRANS,_&ID_TRANS>_>
                *)operator_new(0x40);
    SketchImpl<(anonymous_namespace)::GenField<unsigned_int,_32,_141U,_&(anonymous_namespace)::MulWithClMulReduce,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::SQR2_TABLE_32,_&(anonymous_namespace)::SQR4_TABLE_32,_&(anonymous_namespace)::SQR8_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32,_IdTrans,_&ID_TRANS,_&ID_TRANS>_>
    ::SketchImpl<>(local_10,in_ESI,0x20);
  }
  else {
    local_10 = (SketchImpl<(anonymous_namespace)::GenField<unsigned_int,_32,_141U,_&(anonymous_namespace)::MulWithClMulReduce,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::SQR2_TABLE_32,_&(anonymous_namespace)::SQR4_TABLE_32,_&(anonymous_namespace)::SQR8_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32,_IdTrans,_&ID_TRANS,_&ID_TRANS>_>
                *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return &local_10->super_Sketch;
  }
  __stack_chk_fail();
}

Assistant:

Sketch* ConstructClMul4Bytes(int bits, int implementation) {
    switch (bits) {
#ifdef ENABLE_FIELD_INT_25
    case 25: return new SketchImpl<Field25>(implementation, 25);
#endif
#ifdef ENABLE_FIELD_INT_26
    case 26: return new SketchImpl<Field26>(implementation, 26);
#endif
#ifdef ENABLE_FIELD_INT_27
    case 27: return new SketchImpl<Field27>(implementation, 27);
#endif
#ifdef ENABLE_FIELD_INT_29
    case 29: return new SketchImpl<Field29>(implementation, 29);
#endif
#ifdef ENABLE_FIELD_INT_31
    case 31: return new SketchImpl<Field31>(implementation, 31);
#endif
#ifdef ENABLE_FIELD_INT_32
    case 32: return new SketchImpl<Field32>(implementation, 32);
#endif
    }
    return nullptr;
}